

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.c
# Opt level: O0

int katherine_get_chip_id(katherine_device_t *device,char *s_chip_id)

{
  int w;
  int y;
  int x;
  int chip_id;
  char crd [8];
  int res;
  char *s_chip_id_local;
  katherine_device_t *device_local;
  
  unique0x1000007a = s_chip_id;
  crd._0_4_ = katherine_cmd_echo_chip_id(&device->control_socket);
  if ((crd._0_4_ == 0) &&
     (crd._0_4_ = katherine_cmd_wait_ack_crd(&device->control_socket,(char *)&x), crd._0_4_ == 0)) {
    memset(stack0xffffffffffffffe0,0,0x10);
    sprintf(stack0xffffffffffffffe0,"%c%d-W000%d",(ulong)((x & 0xfU) + 0x40),(ulong)(x >> 4 & 0xf),
            (ulong)(x >> 8 & 0xfff));
    device_local._4_4_ = 0;
  }
  else {
    device_local._4_1_ = crd[0];
    device_local._5_1_ = crd[1];
    device_local._6_1_ = crd[2];
    device_local._7_1_ = crd[3];
  }
  return device_local._4_4_;
}

Assistant:

int
katherine_get_chip_id(katherine_device_t *device, char *s_chip_id)
{
    int res;

    res = katherine_cmd_echo_chip_id(&device->control_socket);
    if (res) goto err;

    char crd[8];
    res = katherine_cmd_wait_ack_crd(&device->control_socket, crd);
    if (res) goto err;

    int chip_id = *(int*) crd;
    int x = (chip_id & 0xF) - 1;
    int y = (chip_id >> 4) & 0xF;
    int w = (chip_id >> 8) & 0xFFF;

    memset(s_chip_id, '\0', KATHERINE_CHIP_ID_STR_SIZE);
    sprintf(s_chip_id, "%c%d-W000%d", 65 + x, y, w);
    return 0;

err:
    return res;
}